

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::run_actions
          (call_matcher<void_(),_std::tuple<>_> *this,call_params_type_t<void_()> *params,
          call_matcher_list<void_()> *saturated_list)

{
  trompeloeil *this_00;
  char *name;
  char *pcVar1;
  sequence_handler_base *psVar2;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar3;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar4;
  int iVar5;
  ulong uVar6;
  string *in_R8;
  side_effect_base<void_()> *a;
  list_elem<trompeloeil::side_effect_base<void_()>_> *plVar7;
  location loc;
  unique_lock<std::recursive_mutex> lock;
  string local_50;
  
  if (((this->sequences)._M_t.
       super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
       .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->max_calls
      == 0) {
    this->reported = true;
    this_00 = (trompeloeil *)(this->super_call_matcher_base<void_()>).name;
    name = (this->super_call_matcher_base<void_()>).loc.file;
    pcVar1 = (char *)(this->super_call_matcher_base<void_()>).loc.line;
    params_string<>(&local_50,params);
    loc.line = (unsigned_long)&local_50;
    loc.file = pcVar1;
    report_forbidden_call(this_00,name,loc,in_R8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  get_lock<void>();
  iVar5 = (*((this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->
            _vptr_sequence_handler_base[3])();
  if ((char)iVar5 == '\0') {
    psVar2 = (this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
    (*psVar2->_vptr_sequence_handler_base[2])
              (psVar2,0,(this->super_call_matcher_base<void_()>).name,
               (this->super_call_matcher_base<void_()>).loc.file,
               (this->super_call_matcher_base<void_()>).loc.line);
  }
  psVar2 = (this->sequences)._M_t.
           super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
           .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
  uVar6 = psVar2->call_count + 1;
  psVar2->call_count = uVar6;
  if (psVar2->min_calls <= uVar6) {
    (*psVar2->_vptr_sequence_handler_base[6])();
  }
  psVar2 = (this->sequences)._M_t.
           super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
           .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
  if (psVar2->call_count == psVar2->max_calls) {
    (*psVar2->_vptr_sequence_handler_base[5])();
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
              ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
    plVar3 = (this->super_call_matcher_base<void_()>).
             super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next;
    plVar4 = (this->super_call_matcher_base<void_()>).
             super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev;
    plVar3->prev = plVar4;
    plVar4->next = plVar3;
    (this->super_call_matcher_base<void_()>).
    super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next =
         (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
    (this->super_call_matcher_base<void_()>).
    super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
              ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
              ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)saturated_list);
    (this->super_call_matcher_base<void_()>).
    super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev =
         (saturated_list->
         super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>).
         super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev;
    (this->super_call_matcher_base<void_()>).
    super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next =
         (list_elem<trompeloeil::call_matcher_base<void_()>_> *)saturated_list;
    ((saturated_list->
     super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>).
     super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev)->next =
         (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
    (saturated_list->
    super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>).
    super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
              ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)saturated_list);
  }
  for (plVar7 = (this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>.next;
      plVar7 != &(this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>;
      plVar7 = plVar7->next) {
    (*plVar7->_vptr_list_elem[2])(plVar7,params);
  }
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_50);
  return;
}

Assistant:

void
    run_actions(
      call_params_type_t<Sig>& params,
      call_matcher_list<Sig> &saturated_list)
    override
    {
      if (sequences->is_forbidden())
      {
        reported = true;
        report_forbidden_call(name, loc, params_string(params));
      }
      auto lock = get_lock();
      {
        if (!sequences->can_be_called())
        {
          sequences->validate(severity::fatal, name, loc);
        }
        sequences->increment_call();
        if (sequences->is_satisfied())
        {
          sequences->retire_predecessors();
        }
        if (sequences->is_saturated())
        {
          sequences->retire();
          this->unlink();
          saturated_list.push_back(this);
        }
      }
      for (auto& a : actions) a.action(params);
    }